

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::create_directories(Twine *Path,bool IgnoreExisting,perms Perms)

{
  char *pcVar1;
  uint uVar2;
  error_category *peVar3;
  char *pcVar4;
  char *pcVar6;
  error_code eVar7;
  StringRef P;
  StringRef Parent;
  SmallString<128U> PathStorage;
  StringRef local_f8;
  StringRef local_e8;
  Twine local_d8;
  SmallVectorImpl<char> local_c0;
  undefined1 local_b0 [128];
  error_category *peVar5;
  
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_f8 = Twine::toStringRef(Path,&local_c0);
  Twine::Twine(&local_d8,&local_f8);
  eVar7 = create_directory(&local_d8,IgnoreExisting,Perms);
  peVar5 = eVar7._M_cat;
  uVar2 = eVar7._M_value;
  peVar3 = (error_category *)std::_V2::generic_category();
  if (uVar2 == 2 && peVar5 == peVar3) {
    pcVar1 = local_f8.Data;
    pcVar6 = (char *)local_f8.Length;
    uVar2 = 2;
    pcVar4 = (char *)anon_unknown.dwarf_1e49a5::parent_path_end(local_f8,native);
    if (pcVar4 < pcVar6) {
      pcVar6 = pcVar4;
    }
    local_e8.Data = pcVar1;
    local_e8.Length = (size_t)pcVar6;
    if (pcVar4 == (char *)0xffffffffffffffff) {
      local_e8.Data = (char *)0x0;
      local_e8.Length = (size_t)(char *)0x0;
    }
    if ((char *)local_e8.Length != (char *)0x0) {
      Twine::Twine(&local_d8,&local_e8);
      eVar7 = create_directories(&local_d8,IgnoreExisting,Perms);
      if (eVar7._M_value == 0) {
        Twine::Twine(&local_d8,&local_f8);
        eVar7 = create_directory(&local_d8,IgnoreExisting,Perms);
      }
      peVar5 = eVar7._M_cat;
      uVar2 = eVar7._M_value;
    }
  }
  if ((undefined1 *)
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_b0) {
    free(local_c0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  eVar7._4_4_ = 0;
  eVar7._M_value = uVar2;
  eVar7._M_cat = peVar5;
  return eVar7;
}

Assistant:

std::error_code create_directories(const Twine &Path, bool IgnoreExisting,
                                   perms Perms) {
  SmallString<128> PathStorage;
  StringRef P = Path.toStringRef(PathStorage);

  // Be optimistic and try to create the directory
  std::error_code EC = create_directory(P, IgnoreExisting, Perms);
  // If we succeeded, or had any error other than the parent not existing, just
  // return it.
  if (EC != errc::no_such_file_or_directory)
    return EC;

  // We failed because of a no_such_file_or_directory, try to create the
  // parent.
  StringRef Parent = path::parent_path(P);
  if (Parent.empty())
    return EC;

  if ((EC = create_directories(Parent, IgnoreExisting, Perms)))
      return EC;

  return create_directory(P, IgnoreExisting, Perms);
}